

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_module.cpp
# Opt level: O0

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::BuildModule
          (spvtools *this,spv_target_env env,MessageConsumer *consumer,string *text,
          uint32_t assemble_options)

{
  bool bVar1;
  uint *binary_00;
  size_type size;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_98;
  undefined4 local_74;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  SpirvTools local_38;
  SpirvTools t;
  uint32_t assemble_options_local;
  string *text_local;
  MessageConsumer *consumer_local;
  spv_target_env env_local;
  
  t.impl_._M_t.
  super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
  .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_ = assemble_options;
  SpirvTools::SpirvTools(&local_38,env);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,consumer);
  SpirvTools::SetMessageConsumer
            (&local_38,
             (MessageConsumer *)
             &binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  bVar1 = SpirvTools::Assemble
                    (&local_38,text,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                     t.impl_._M_t.
                     super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                     .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl._4_4_)
  ;
  if (bVar1) {
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function(&local_98,consumer);
    binary_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    BuildModule(this,env,&local_98,binary_00,size);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    ~function(&local_98);
  }
  else {
    std::unique_ptr<spvtools::opt::IRContext,std::default_delete<spvtools::opt::IRContext>>::
    unique_ptr<std::default_delete<spvtools::opt::IRContext>,void>
              ((unique_ptr<spvtools::opt::IRContext,std::default_delete<spvtools::opt::IRContext>> *
               )this,(nullptr_t)0x0);
  }
  local_74 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  SpirvTools::~SpirvTools(&local_38);
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opt::IRContext> BuildModule(spv_target_env env,
                                            MessageConsumer consumer,
                                            const std::string& text,
                                            uint32_t assemble_options) {
  SpirvTools t(env);
  t.SetMessageConsumer(consumer);
  std::vector<uint32_t> binary;
  if (!t.Assemble(text, &binary, assemble_options)) return nullptr;
  return BuildModule(env, consumer, binary.data(), binary.size());
}